

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

Float pbrt::ErfInv(Float a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  float fVar5;
  undefined1 extraout_var [60];
  
  auVar3._4_60_ = in_register_00001204;
  auVar3._0_4_ = a;
  auVar1 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar3._0_16_,auVar3._0_16_);
  auVar1 = vmaxss_avx(SUB6416(ZEXT464(0x800000),0),auVar1);
  auVar4._0_4_ = logf(auVar1._0_4_);
  auVar4._4_60_ = extraout_var;
  if ((uint)ABS(auVar4._0_4_) < 0x7f800000) {
    auVar1._8_4_ = 0x7fffffff;
    auVar1._0_8_ = 0x7fffffff7fffffff;
    auVar1._12_4_ = 0x7fffffff;
    auVar2 = auVar4._0_16_;
    auVar1 = vandps_avx512vl(auVar2,auVar1);
    if (auVar1._0_4_ <= 6.125) {
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x31bae000),0),auVar2,ZEXT416(0x3419da2c));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x35a4c94e));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x33f295dd));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0xb86b8609));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0xb91adf4d));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x3b17b201));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x3c3d0f26));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0xbe6d9577));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x3f62dfc4));
      fVar5 = auVar1._0_4_;
    }
    else {
      auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x2fa6f5a2),0),auVar2,ZEXT416(0x32fbe4d7));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x35a3f289));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x37ee53ef));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x39ce55c9));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x3b46606f));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x3b9e5490));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0xbe877fb3));
      auVar1 = vfmadd213ss_fma(auVar1,auVar2,ZEXT416(0x3f570b52));
      fVar5 = auVar1._0_4_;
    }
    return fVar5 * a;
  }
  LogFatal<char_const(&)[28]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.h"
             ,0x2a6,"Check failed: %s",(char (*) [28])"!IsNaN(t) && !std::isinf(t)");
}

Assistant:

PBRT_CPU_GPU
inline Float ErfInv(Float a) {
#ifdef PBRT_IS_GPU_CODE
    return erfinv(a);
#else
    // https://stackoverflow.com/a/49743348
    float p;
    float t = std::log(std::max(FMA(a, -a, 1), std::numeric_limits<Float>::min()));
    CHECK(!IsNaN(t) && !std::isinf(t));
    if (std::abs(t) > 6.125f) {          // maximum ulp error = 2.35793
        p = 3.03697567e-10f;             //  0x1.4deb44p-32
        p = FMA(p, t, 2.93243101e-8f);   //  0x1.f7c9aep-26
        p = FMA(p, t, 1.22150334e-6f);   //  0x1.47e512p-20
        p = FMA(p, t, 2.84108955e-5f);   //  0x1.dca7dep-16
        p = FMA(p, t, 3.93552968e-4f);   //  0x1.9cab92p-12
        p = FMA(p, t, 3.02698812e-3f);   //  0x1.8cc0dep-9
        p = FMA(p, t, 4.83185798e-3f);   //  0x1.3ca920p-8
        p = FMA(p, t, -2.64646143e-1f);  // -0x1.0eff66p-2
        p = FMA(p, t, 8.40016484e-1f);   //  0x1.ae16a4p-1
    } else {                             // maximum ulp error = 2.35456
        p = 5.43877832e-9f;              //  0x1.75c000p-28
        p = FMA(p, t, 1.43286059e-7f);   //  0x1.33b458p-23
        p = FMA(p, t, 1.22775396e-6f);   //  0x1.49929cp-20
        p = FMA(p, t, 1.12962631e-7f);   //  0x1.e52bbap-24
        p = FMA(p, t, -5.61531961e-5f);  // -0x1.d70c12p-15
        p = FMA(p, t, -1.47697705e-4f);  // -0x1.35be9ap-13
        p = FMA(p, t, 2.31468701e-3f);   //  0x1.2f6402p-9
        p = FMA(p, t, 1.15392562e-2f);   //  0x1.7a1e4cp-7
        p = FMA(p, t, -2.32015476e-1f);  // -0x1.db2aeep-3
        p = FMA(p, t, 8.86226892e-1f);   //  0x1.c5bf88p-1
    }
    return a * p;
#endif  // PBRT_IS_GPU_CODE
}